

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::SerializeWithCachedSizes
          (ItemSimilarityRecommender_ConnectedItem *this,CodedOutputStream *output)

{
  uint64 uVar1;
  double dVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ItemSimilarityRecommender_ConnectedItem *this_local;
  
  uVar1 = itemid(this);
  if (uVar1 != 0) {
    uVar1 = itemid(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar1,output);
  }
  dVar2 = similarityscore(this);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    dVar2 = similarityscore(this);
    google::protobuf::internal::WireFormatLite::WriteDouble(2,dVar2,output);
  }
  return;
}

Assistant:

void ItemSimilarityRecommender_ConnectedItem::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ItemSimilarityRecommender.ConnectedItem)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 itemId = 1;
  if (this->itemid() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->itemid(), output);
  }

  // double similarityScore = 2;
  if (this->similarityscore() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(2, this->similarityscore(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ItemSimilarityRecommender.ConnectedItem)
}